

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMAttrMapImpl::DOMAttrMapImpl
          (DOMAttrMapImpl *this,DOMNode *ownerNod,DOMAttrMapImpl *defaults)

{
  int iVar1;
  undefined4 extraout_var;
  
  (this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap = (_func_int **)&PTR__DOMAttrMapImpl_003fb9f0;
  this->fOwnerNode = ownerNod;
  this->fNodes = (DOMNodeVector *)0x0;
  this->attrDefaults = false;
  if (defaults != (DOMAttrMapImpl *)0x0) {
    iVar1 = (*(defaults->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[5])(defaults);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xd])(this,1);
      (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[10])(this,defaults);
      return;
    }
  }
  return;
}

Assistant:

DOMAttrMapImpl::DOMAttrMapImpl(DOMNode *ownerNod, const DOMAttrMapImpl *defaults)
{
    this->fOwnerNode=ownerNod;
    this->fNodes = 0;
	hasDefaults(false);
	if (defaults != 0)
	{
		if (defaults->getLength() > 0)
		{
			hasDefaults(true);
			cloneContent(defaults);
		}
	}
}